

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict get_compound_literal(node_t_conflict n,int *addr_p)

{
  int local_24;
  int addr;
  int *addr_p_local;
  node_t_conflict n_local;
  
  local_24 = 0;
  addr_p_local = (int *)n;
  while( true ) {
    if (addr_p_local == (int *)0x0) {
      return (node_t_conflict)0x0;
    }
    switch(*addr_p_local) {
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x40:
      if (local_24 < 0) {
        return (node_t_conflict)0x0;
      }
      *addr_p = (uint)(0 < local_24);
      return (node_t_conflict)addr_p_local;
    default:
      return (node_t_conflict)0x0;
    case 0x34:
      local_24 = local_24 + 1;
      break;
    case 0x35:
      local_24 = local_24 + -1;
      break;
    case 0x3f:
    }
    if (((local_24 != -1) && (local_24 != 0)) && (local_24 != 1)) break;
    addr_p_local = (int *)DLIST_node_t_head((DLIST_node_t *)(addr_p_local + 8));
  }
  return (node_t_conflict)0x0;
}

Assistant:

static node_t get_compound_literal (node_t n, int *addr_p) {
  for (int addr = 0; n != NULL; n = NL_HEAD (n->u.ops)) {
    switch (n->code) {
    case N_ADDR: addr++; break;
    case N_DEREF: addr--; break;
    case N_CAST: break;  // ???
    case N_STR:
    case N_STR16:
    case N_STR32:
    case N_COMPOUND_LITERAL:
      if (addr < 0) return NULL;
      *addr_p = addr > 0;
      return n;
      break;
    default: return NULL;
    }
    if (addr != -1 && addr != 0 && addr != 1) return NULL;
  }
  return NULL;
}